

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::EncodedDescriptorDatabase::~EncodedDescriptorDatabase
          (EncodedDescriptorDatabase *this)

{
  size_type sVar1;
  reference ppvVar2;
  int local_14;
  int i;
  EncodedDescriptorDatabase *this_local;
  
  (this->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__EncodedDescriptorDatabase_006fa8e0;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->files_to_delete_);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->files_to_delete_,(long)local_14);
    operator_delete(*ppvVar2);
    local_14 = local_14 + 1;
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->files_to_delete_);
  SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::~DescriptorIndex
            (&this->index_);
  DescriptorDatabase::~DescriptorDatabase(&this->super_DescriptorDatabase);
  return;
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (int i = 0; i < files_to_delete_.size(); i++) {
    operator delete(files_to_delete_[i]);
  }
}